

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.cpp
# Opt level: O0

void Al::internal::trace::save_trace_entry(string *entry,bool progress)

{
  byte in_SIL;
  value_type *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  if ((in_SIL & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),in_RDI);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),in_RDI);
  }
  return;
}

Assistant:

void save_trace_entry(std::string entry, bool progress) {
#ifdef AL_THREAD_MULTIPLE
  std::lock_guard<std::mutex> lock(log_mutex);
#endif
  if (progress) {
    pe_trace_log.push_back(std::move(entry));
  } else {
    trace_log.push_back(std::move(entry));
  }
}